

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O2

void __thiscall
myvk::CommandBuffer::CmdBeginRenderPass
          (CommandBuffer *this,Ptr<RenderPass> *render_pass,Ptr<Framebuffer> *framebuffer,
          vector<VkClearValue,_std::allocator<VkClearValue>_> *clear_values,
          VkSubpassContents subpass_contents)

{
  element_type *peVar1;
  VkRenderPassBeginInfo local_48;
  
  local_48.pNext = (void *)0x0;
  local_48.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
  local_48._4_4_ = 0;
  local_48.renderPass =
       ((render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       m_render_pass;
  peVar1 = (framebuffer->super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.framebuffer = (peVar1->super_FramebufferBase).m_framebuffer;
  local_48.renderArea.offset.x = 0;
  local_48.renderArea.offset.y = 0;
  local_48.renderArea.extent = (peVar1->super_FramebufferBase).m_extent;
  local_48.pClearValues =
       (clear_values->super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_48._48_8_ =
       (ulong)((long)(clear_values->super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>)
                     ._M_impl.super__Vector_impl_data._M_finish - (long)local_48.pClearValues) >> 4
       & 0xffffffff;
  (*vkCmdBeginRenderPass)(this->m_command_buffer,&local_48,subpass_contents);
  return;
}

Assistant:

void CommandBuffer::CmdBeginRenderPass(const Ptr<RenderPass> &render_pass, const Ptr<Framebuffer> &framebuffer,
                                       const std::vector<VkClearValue> &clear_values,
                                       VkSubpassContents subpass_contents) const {
	VkRenderPassBeginInfo render_begin_info = {};
	render_begin_info.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
	render_begin_info.renderPass = render_pass->GetHandle();
	render_begin_info.framebuffer = framebuffer->GetHandle();
	render_begin_info.renderArea.offset = {0, 0};
	render_begin_info.renderArea.extent = framebuffer->GetExtent();
	render_begin_info.clearValueCount = clear_values.size();
	render_begin_info.pClearValues = clear_values.data();

	vkCmdBeginRenderPass(m_command_buffer, &render_begin_info, subpass_contents);
}